

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

Test * ParserTestPathVariables::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x1e8);
  ParserTestPathVariables((ParserTestPathVariables *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(ParserTest, PathVariables) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"dir = out\n"
"build $dir/exe: cat src\n"));

  EXPECT_FALSE(state.LookupNode("$dir/exe"));
  EXPECT_TRUE(state.LookupNode("out/exe"));
}